

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateProto2NamespaceEnumSpecializations
          (FileGenerator *this,Printer *printer)

{
  pointer ppEVar1;
  bool bVar2;
  int i;
  ulong uVar3;
  
  bVar2 = HasEnumDefinitions(this->file_);
  if (bVar2) {
    io::Printer::Print(printer,"\n#ifndef SWIG\nnamespace google {\nnamespace protobuf {\n\n");
    for (uVar3 = 0;
        ppEVar1 = (this->enum_generators_).
                  super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->enum_generators_).
                              super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3);
        uVar3 = uVar3 + 1) {
      EnumGenerator::GenerateGetEnumDescriptorSpecializations(ppEVar1[uVar3],printer);
    }
    io::Printer::Print(printer,
                       "\n}  // namespace protobuf\n}  // namespace google\n#endif  // SWIG\n");
    return;
  }
  return;
}

Assistant:

void FileGenerator::GenerateProto2NamespaceEnumSpecializations(
    io::Printer* printer) {
  // Emit GetEnumDescriptor specializations into google::protobuf namespace:
  if (HasEnumDefinitions(file_)) {
    // The SWIG conditional is to avoid a null-pointer dereference
    // (bug 1984964) in swig-1.3.21 resulting from the following syntax:
    //   namespace X { void Y<Z::W>(); }
    // which appears in GetEnumDescriptor() specializations.
    printer->Print(
        "\n"
        "#ifndef SWIG\n"
        "namespace google {\nnamespace protobuf {\n"
        "\n");
    for (int i = 0; i < enum_generators_.size(); i++) {
      enum_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
    }
    printer->Print(
        "\n"
        "}  // namespace protobuf\n}  // namespace google\n"
        "#endif  // SWIG\n");
  }
}